

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O2

uint32_t * createDFDAlpha(int bigEndian,int bytes,VkSuffix suffix)

{
  int offset;
  uint32_t *DFD;
  int sampleNo;
  int iVar1;
  
  if (bigEndian == 0) {
    DFD = writeHeader(1,bytes,suffix,i_COLOR);
    writeSample(DFD,0,3,bytes << 3,0,1,1,suffix);
  }
  else {
    sampleNo = 0;
    DFD = writeHeader(bytes,bytes,suffix,i_COLOR);
    iVar1 = 0;
    if (0 < bytes) {
      iVar1 = bytes;
    }
    offset = bytes * 8;
    for (; offset = offset + -8, iVar1 != sampleNo; sampleNo = sampleNo + 1) {
      writeSample(DFD,sampleNo,3,8,offset,(uint)(bytes + -1 == sampleNo),(uint)(sampleNo == 0),
                  suffix);
    }
  }
  return DFD;
}

Assistant:

uint32_t *createDFDAlpha(int bigEndian, int bytes,
                         enum VkSuffix suffix) {
    uint32_t *DFD;
    int channel = 3; /* alpha channel */
    if (bigEndian) {
        int channelByte;
        /* Number of samples = number of channels * bytes per channel */
        DFD = writeHeader(bytes, bytes, suffix, i_COLOR);
        /* Loop over the bytes that constitute a channel */
        for (channelByte = 0; channelByte < bytes; ++channelByte) {
            writeSample(DFD, channelByte, channel,
                        8, 8 * (bytes - channelByte - 1),
                        channelByte == bytes-1, channelByte == 0, suffix);
        }
    } else { /* Little-endian */
        /* One sample per channel */
        DFD = writeHeader(1, bytes, suffix, i_COLOR);
        writeSample(DFD, 0, channel,
                    8 * bytes, 0,
                    1, 1, suffix);
    }
    return DFD;
}